

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

void Gia_QbfDumpFile(Gia_Man_t *pGia,int nPars)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *p;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *vForAlls;
  Vec_Int_t *vExists;
  char *pFileName;
  Vec_Int_t *p_01;
  int iVar5;
  
  p = Mf_ManGenerateCnf(pGia,8,0,1,0);
  iVar3 = p->nVars;
  p_00 = Vec_IntAlloc(iVar3);
  p_00->nSize = iVar3;
  memset(p_00->pArray,0,(long)iVar3 << 2);
  for (iVar5 = 0; iVar5 < pGia->vCis->nSize; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCi(pGia,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (iVar5 < nPars) {
      piVar1 = p->pVarNums;
      pGVar4 = Gia_ManCi(pGia,iVar5);
      iVar2 = Gia_ObjId(pGia,pGVar4);
      Vec_IntWriteEntry(p_00,piVar1[iVar2],1);
    }
  }
  vForAlls = Vec_IntAlloc(nPars);
  vExists = Vec_IntAlloc(pGia->vCis->nSize - nPars);
  iVar5 = 0;
  iVar2 = 0;
  if (0 < iVar3) {
    iVar5 = 0;
    iVar2 = iVar3;
  }
  for (; iVar2 != iVar5; iVar5 = iVar5 + 1) {
    iVar3 = Vec_IntEntry(p_00,iVar5);
    p_01 = vForAlls;
    if (iVar3 == 0) {
      p_01 = vExists;
    }
    Vec_IntPush(p_01,iVar5);
  }
  pFileName = Extra_FileNameGenericAppend(pGia->pSpec,".qdimacs");
  Cnf_DataWriteIntoFile(p,pFileName,0,vForAlls,vExists);
  Cnf_DataFree(p);
  Vec_IntFree(vForAlls);
  Vec_IntFree(vExists);
  Vec_IntFree(p_00);
  printf("The 2QBF formula was written into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Gia_QbfDumpFile( Gia_Man_t * pGia, int nPars )
{
    // original problem: \exists p \forall x \exists y.  M(p,x,y)
    // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( pGia, 8, 0, 1, 0 );
    Vec_Int_t * vVarMap, * vForAlls, * vExists;
    Gia_Obj_t * pObj;
    char * pFileName;
    int i, Entry;
    // create var map
    vVarMap = Vec_IntStart( pCnf->nVars );
    Gia_ManForEachCi( pGia, pObj, i )
        if ( i < nPars )
            Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Gia_ManCiIdToId(pGia, i)], 1 );
    // create various maps
    vForAlls = Vec_IntAlloc( nPars );
    vExists = Vec_IntAlloc( Gia_ManCiNum(pGia) - nPars );
    Vec_IntForEachEntry( vVarMap, Entry, i )
        if ( Entry )
            Vec_IntPush( vForAlls, i );
        else
            Vec_IntPush( vExists, i );
    // generate CNF
    pFileName = Extra_FileNameGenericAppend( pGia->pSpec, ".qdimacs" );
    Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vForAlls );
    Vec_IntFree( vExists );
    Vec_IntFree( vVarMap );
    printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
}